

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int disposition_get_first(DISPOSITION_HANDLE disposition,delivery_number *first_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  DISPOSITION_INSTANCE *disposition_instance;
  uint32_t item_count;
  int result;
  delivery_number *first_value_local;
  DISPOSITION_HANDLE disposition_local;
  
  if (disposition == (DISPOSITION_HANDLE)0x0) {
    disposition_instance._4_4_ = 0x21ce;
  }
  else {
    _item_count = first_value;
    first_value_local = (delivery_number *)disposition;
    iVar1 = amqpvalue_get_composite_item_count
                      (disposition->composite_value,(uint32_t *)&disposition_instance);
    if (iVar1 == 0) {
      if ((uint)disposition_instance < 2) {
        disposition_instance._4_4_ = 0x21dc;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(disposition->composite_value,1);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          disposition_instance._4_4_ = 0x21e4;
        }
        else {
          iVar1 = amqpvalue_get_uint(value,_item_count);
          if (iVar1 == 0) {
            disposition_instance._4_4_ = 0;
          }
          else {
            disposition_instance._4_4_ = 0x21eb;
          }
        }
      }
    }
    else {
      disposition_instance._4_4_ = 0x21d6;
    }
  }
  return disposition_instance._4_4_;
}

Assistant:

int disposition_get_first(DISPOSITION_HANDLE disposition, delivery_number* first_value)
{
    int result;

    if (disposition == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)disposition;
        if (amqpvalue_get_composite_item_count(disposition_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 1)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(disposition_instance->composite_value, 1);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_delivery_number(item_value, first_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}